

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costSecondPartialDerivativeWRTControl
          (L2NormCost *this,double param_1,VectorDynSize *param_2,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  L2NormCostImplementation *pLVar1;
  bool bVar2;
  allocator<char> local_41;
  string local_40;
  
  pLVar1 = this->m_pimpl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"control",&local_41);
  bVar2 = CostAttributes::getHessian(&pLVar1->controlCost,control,partialDerivative,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool L2NormCost::costSecondPartialDerivativeWRTControl(double /*time*/, const VectorDynSize &/*state*/, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            return m_pimpl->controlCost.getHessian(control, partialDerivative, "control");
        }